

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

S2Point * __thiscall
S2Builder::GetSeparationSite
          (S2Point *__return_storage_ptr__,S2Builder *this,S2Point *site_to_avoid,S2Point *v0,
          S2Point *v1,InputEdgeId input_edge_id)

{
  double dVar1;
  pointer pVVar2;
  pointer ppVar3;
  VType VVar4;
  long lVar5;
  S2Point *b;
  S2Point *y;
  S2Point *pSVar6;
  double *ap;
  bool bVar7;
  double dVar8;
  S2Point gap_max;
  S2Point n;
  S2Point gap_min;
  S2Point local_a8;
  S2Point local_90;
  double local_78;
  double dStack_70;
  Vector3_d local_68;
  S2Point local_48;
  
  pVVar2 = (this->input_vertices_).
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar3 = (this->input_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar6 = pVVar2 + ppVar3[input_edge_id].first;
  b = pVVar2 + ppVar3[input_edge_id].second;
  dVar8 = b->c_[0] - pSVar6->c_[0];
  local_78 = b->c_[1] - pSVar6->c_[1];
  dStack_70 = b->c_[2] - pSVar6->c_[2];
  S2::RobustCrossProd(&local_68,pSVar6,b);
  y = &local_68;
  S2::Project(__return_storage_ptr__,site_to_avoid,pSVar6,b,&local_68);
  pSVar6 = &local_48;
  GetCoverageEndpoint(pSVar6,this,v0,b,y,&local_68);
  local_a8.c_[2] = -local_68.c_[2];
  local_a8.c_[0] = -local_68.c_[0];
  local_a8.c_[1] = (VType)((ulong)local_68.c_[1] ^ 0x8000000000000000);
  GetCoverageEndpoint(&local_90,this,v1,b,y,&local_a8);
  if (((__return_storage_ptr__->c_[2] - local_48.c_[2]) * dStack_70 +
       (__return_storage_ptr__->c_[0] - local_48.c_[0]) * dVar8 + 0.0 +
       (__return_storage_ptr__->c_[1] - local_48.c_[1]) * local_78 < 0.0) ||
     (pSVar6 = &local_90,
     dStack_70 * (local_90.c_[2] - __return_storage_ptr__->c_[2]) +
     dVar8 * (local_90.c_[0] - __return_storage_ptr__->c_[0]) + 0.0 +
     local_78 * (local_90.c_[1] - __return_storage_ptr__->c_[1]) < 0.0)) {
    __return_storage_ptr__->c_[2] = pSVar6->c_[2];
    VVar4 = pSVar6->c_[1];
    __return_storage_ptr__->c_[0] = pSVar6->c_[0];
    __return_storage_ptr__->c_[1] = VVar4;
  }
  SnapSite(&local_a8,this,__return_storage_ptr__);
  __return_storage_ptr__->c_[2] = local_a8.c_[2];
  __return_storage_ptr__->c_[0] = local_a8.c_[0];
  __return_storage_ptr__->c_[1] = local_a8.c_[1];
  lVar5 = 0;
  do {
    dVar8 = *(double *)((long)v0->c_ + lVar5);
    dVar1 = *(double *)((long)__return_storage_ptr__->c_ + lVar5);
    if ((dVar8 != dVar1) || (NAN(dVar8) || NAN(dVar1))) break;
    bVar7 = lVar5 != 0x10;
    lVar5 = lVar5 + 8;
  } while (bVar7);
  if ((dVar8 != dVar1) || (NAN(dVar8) || NAN(dVar1))) {
    lVar5 = 0;
    do {
      dVar8 = *(double *)((long)v1->c_ + lVar5);
      dVar1 = *(double *)((long)__return_storage_ptr__->c_ + lVar5);
      if ((dVar8 != dVar1) || (NAN(dVar8) || NAN(dVar1))) break;
      bVar7 = lVar5 != 0x10;
      lVar5 = lVar5 + 8;
    } while (bVar7);
    if ((dVar8 != dVar1) || (NAN(dVar8) || NAN(dVar1))) {
      return __return_storage_ptr__;
    }
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x393,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a8.c_[1],"Check failed: (v1) != (new_site) ",0x21);
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x392,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a8.c_[1],"Check failed: (v0) != (new_site) ",0x21);
  }
  abort();
}

Assistant:

S2Point S2Builder::GetSeparationSite(const S2Point& site_to_avoid,
                                     const S2Point& v0, const S2Point& v1,
                                     InputEdgeId input_edge_id) const {
  // Define the "coverage disc" of a site S to be the disc centered at S with
  // radius "snap_radius".  Similarly, define the "coverage interval" of S for
  // an edge XY to be the intersection of XY with the coverage disc of S.  The
  // SnapFunction implementations guarantee that the only way that a snapped
  // edge can be closer than min_edge_vertex_separation() to a non-snapped
  // site (i.e., site_to_avoid) if is there is a gap in the coverage of XY
  // near this site.  We can fix this problem simply by adding a new site to
  // fill this gap, located as closely as possible to the site to avoid.
  //
  // To calculate the coverage gap, we look at the two snapped sites on
  // either side of site_to_avoid, and find the endpoints of their coverage
  // intervals.  The we place a new site in the gap, located as closely as
  // possible to the site to avoid.  Note that the new site may move when it
  // is snapped by the snap_function, but it is guaranteed not to move by
  // more than snap_radius and therefore its coverage interval will still
  // intersect the gap.
  const InputEdge& edge = input_edges_[input_edge_id];
  const S2Point& x = input_vertices_[edge.first];
  const S2Point& y = input_vertices_[edge.second];
  Vector3_d xy_dir = y - x;
  S2Point n = S2::RobustCrossProd(x, y);
  S2Point new_site = S2::Project(site_to_avoid, x, y, n);
  S2Point gap_min = GetCoverageEndpoint(v0, x, y, n);
  S2Point gap_max = GetCoverageEndpoint(v1, y, x, -n);
  if ((new_site - gap_min).DotProd(xy_dir) < 0) {
    new_site = gap_min;
  } else if ((gap_max - new_site).DotProd(xy_dir) < 0) {
    new_site = gap_max;
  }
  new_site = SnapSite(new_site);
  S2_DCHECK_NE(v0, new_site);
  S2_DCHECK_NE(v1, new_site);
  return new_site;
}